

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O3

bool __thiscall
pktalloc::LightVector<pktalloc::Allocator::WindowHeader_*,_25U>::SetSize_NoCopy
          (LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *this,uint elements)

{
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *pLVar1;
  WindowHeader **ppWVar2;
  uint uVar3;
  
  if (this->Allocated < elements) {
    uVar3 = elements * 3 >> 1;
    ppWVar2 = (WindowHeader **)operator_new__((ulong)uVar3 * 8,(nothrow_t *)&std::nothrow);
    if (ppWVar2 == (WindowHeader **)0x0) {
      return false;
    }
    pLVar1 = (LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *)this->DataPtr;
    this->Allocated = uVar3;
    this->DataPtr = ppWVar2;
    if (pLVar1 != (LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *)0x0 && pLVar1 != this) {
      operator_delete__(pLVar1);
    }
  }
  this->Size = elements;
  return true;
}

Assistant:

bool SetSize_NoCopy(unsigned elements)
    {
        PKTALLOC_DEBUG_ASSERT(Size <= Allocated);

        // If it is actually expanding, and it needs to grow:
        if (elements > Allocated)
        {
            const unsigned newAllocated = (elements * 3) / 2;
            T* newData = new(std::nothrow) T[newAllocated];
            if (!newData)
                return false;
            T* oldData = DataPtr;
            Allocated  = newAllocated;
            DataPtr    = newData;

            // Delete old data without copying
            if (oldData != &PreallocatedData[0]) {
                delete[] oldData;
            }
        }

        Size = elements;
        return true;
    }